

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O1

void default_set_object_value_method_proc(Am_Object *command_obj,Am_Object *obj,Am_Value *new_value)

{
  int iVar1;
  Am_Value *this;
  
  this = Am_Object::Get(command_obj,0x19c,0);
  iVar1 = Am_Value::operator_cast_to_int(this);
  Am_Object::Set(obj,(Am_Slot_Key)iVar1,new_value,0);
  return;
}

Assistant:

Am_Define_Method(Am_Set_Object_Property_Value_Method, void,
                 default_set_object_value_method,
                 (Am_Object command_obj, Am_Object obj, Am_Value new_value))
{
  Am_Slot_Key slot;
  slot = (int)command_obj.Get(Am_SLOT_FOR_VALUE);
#ifdef DEBUG
  if (Am_Inter_Tracing(Am_INTER_TRACE_SETTING)) {
    const char *name = Am_Get_Slot_Name(slot);
    std::cout << "++ Am_Graphics_Set_Property_Command " << command_obj
              << " setting the ";
    if (name)
      std::cout << name;
    else
      std::cout << slot;
    std::cout << " of " << obj << " to " << new_value << std::endl
              << std::flush;
  }
#endif

  obj.Set(slot, new_value);
}